

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolledbitpacking.h
# Opt level: O0

void FastPForLib::__pack_tight<27u,false>(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  sbyte sVar2;
  long in_RSI;
  uint32_t *in_RDI;
  uint32_t v;
  uint32_t inword;
  int i;
  uint32_t pointer;
  int local_18;
  uint local_14;
  uint32_t *local_8;
  
  local_14 = 0;
  local_8 = in_RDI;
  while (local_14 < 0x360) {
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      uVar1 = __bitmask<27u,false>(*local_8);
      sVar2 = (sbyte)(local_14 & 0x1f);
      *(uint32_t *)(in_RSI + (ulong)(local_14 >> 5) * 4) =
           uVar1 << sVar2 | *(uint *)(in_RSI + (ulong)(local_14 >> 5) * 4);
      if (5 < (local_14 & 0x1f)) {
        *(uint32_t *)(in_RSI + (ulong)((local_14 >> 5) + 1) * 4) = uVar1 >> (0x20U - sVar2 & 0x1f);
      }
      local_14 = local_14 + 0x1b;
      local_8 = local_8 + 1;
    }
  }
  return;
}

Assistant:

void __pack_tight(const uint32_t *__restrict__ in, uint32_t *__restrict__ out) {
  assert(bit <= 32);
  if (bit == 32) {
    for (int k = 0; k < 32; ++k) {
      out[k] = in[k];
    }
    return;
  }

  if (bit == 16) {
    for (uint32_t outer = 0; outer < 16; ++outer) {
      for (uint32_t inwordpointer = 0; inwordpointer < 32; inwordpointer += 16)
        *out |= __bitmask<bit, mask>(*(in++)) << inwordpointer;
      ++out;
    }
    return;
  }
  if (bit == 8) {
    for (uint32_t outer = 0; outer < 8; ++outer) {
      for (uint32_t inwordpointer = 0; inwordpointer < 32; inwordpointer += 8)
        *out |= __bitmask<bit, mask>(*(in++)) << inwordpointer;
      ++out;
    }
    return;
  }
#if !defined(_MSC_VER) && !defined(__INTEL_COMPILER)
  enum { mygcd = gcd(bit, 32) };
#else
  const uint32_t mygcd = gcd(bit, 32);
#endif
  // iterate over bit position of the output
  if ((bit & 1) == 0) {
    for (uint32_t t = 0; t < mygcd; ++t) {
      for (uint32_t pointer = 0; pointer < 32 * bit / mygcd; pointer += bit) {
        uint32_t inword = (pointer % 32);
        const uint32_t v = __bitmask<bit, mask>(*in++);
        out[pointer / 32] |= v << inword;
        if (inword > 32 - bit)
          out[pointer / 32 + 1] = v >> (32 - inword);
      }
      out += bit / mygcd;
    }
  } else {
    for (uint32_t pointer = 0; pointer < 32 * bit;) {
      for (int i = 0; i < 2; ++i, pointer += bit) {
        uint32_t inword = (pointer % 32);
        const uint32_t v = __bitmask<bit, mask>(*in++);
        out[pointer / 32] |= v << inword;
        if (inword > 32 - bit)
          out[pointer / 32 + 1] = v >> (32 - inword);
      }
    }
    out += bit / mygcd;
  }
}